

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

bool __thiscall helics::apps::TemplateMatcher::loadTemplate(TemplateMatcher *this,json *iTemplate)

{
  size_type sVar1;
  value_t vVar2;
  pointer pcVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
  *this_00;
  long lVar4;
  array_t *paVar5;
  bool bVar6;
  size_type __n;
  void *pvVar7;
  const_iterator cVar8;
  const_reference pvVar9;
  iterator iVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  reference this_01;
  reference pvVar12;
  size_t sVar13;
  object_t *poVar14;
  size_t __n_00;
  string *this_02;
  ulong uVar15;
  size_type sVar16;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *local_130;
  const_iterator __begin3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_e0;
  string tname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  valueNames;
  size_type local_78;
  pointer pcStack_70;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_60;
  undefined8 local_40;
  vector<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *local_38;
  
  fileops::getName((string *)&tname,iTemplate);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (string *)&tname);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tname._M_dataplus._M_p != &tname.field_2) {
    operator_delete(tname._M_dataplus._M_p,
                    CONCAT71(tname.field_2._M_allocated_capacity._1_7_,tname.field_2._M_local_buf[0]
                            ) + 1);
  }
  __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,"${",0,
                   2);
  if (__n == 0xffffffffffffffff) {
    return false;
  }
  if (__n == 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[1]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->intermediaries,(char (*) [1])0x43a1a2);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tname,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,0,__n);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->intermediaries,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tname._M_dataplus._M_p != &tname.field_2) {
      operator_delete(tname._M_dataplus._M_p,
                      CONCAT71(tname.field_2._M_allocated_capacity._1_7_,
                               tname.field_2._M_local_buf[0]) + 1);
    }
  }
  valueNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  valueNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  valueNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&this->intermediaries;
  local_e0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)paVar11;
  do {
    local_40 = CONCAT71((int7)((ulong)paVar11 >> 8),__n == 0xffffffffffffffff);
    if (__n == 0xffffffffffffffff) {
      local_38 = &this->templatePossibilities;
      CLI::std::
      vector<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::resize(local_38,(long)valueNames.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)valueNames.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5);
      local_e0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->keys;
      CLI::std::
      vector<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::resize((vector<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_e0,
               (long)valueNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)valueNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
      local_130 = iTemplate;
      if (((iTemplate->m_data).m_type == object) &&
         (cVar8 = std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                  ::_M_find_tr<char[7],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                              *)(iTemplate->m_data).m_value.object,(char (*) [7])0x42e5b1),
         (_Rb_tree_header *)cVar8._M_node !=
         &(((iTemplate->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
        local_130 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)iTemplate,"fields");
      }
      if (valueNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          valueNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) goto LAB_0017023a;
      uVar15 = 0;
      goto LAB_0016fe98;
    }
    uVar15 = (this->templateName)._M_string_length;
    __n_00 = uVar15 - __n;
    sVar16 = 0xffffffffffffffff;
    if (__n <= uVar15 && __n_00 != 0) {
      pcVar3 = (this->templateName)._M_dataplus._M_p;
      pvVar7 = memchr(pcVar3 + __n,0x7d,__n_00);
      sVar16 = -(ulong)(pvVar7 == (void *)0x0) | (long)pvVar7 - (long)pcVar3;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tname,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,__n + 2,
               (sVar16 - __n) - 2);
    if ((iTemplate->m_data).m_type == object) {
      cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[7],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                          *)(iTemplate->m_data).m_value.object,(char (*) [7])0x42e5b1);
      this_00 = &((iTemplate->m_data).m_value.object)->_M_t;
      sVar1 = __n;
      if ((_Rb_tree_header *)cVar8._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
        if ((iTemplate->m_data).m_type != object) goto LAB_0016fd19;
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                 ::find(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&tname);
        poVar14 = (iTemplate->m_data).m_value.object;
LAB_0016fcd6:
        if ((_Rb_tree_header *)iVar10._M_node != &(poVar14->_M_t)._M_impl.super__Rb_tree_header) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&valueNames,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tname);
          sVar1 = sVar16 + 1;
          __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,"${",
                     sVar1,2);
          if (__n != sVar1) {
            if (__n == 0xffffffffffffffff) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,sVar1
                     ,0xffffffffffffffff);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        (local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&__begin3);
              if (__begin3.m_object != (pointer)&__begin3.m_it.array_iterator) {
                operator_delete(__begin3.m_object,
                                (ulong)&((__begin3.m_it.array_iterator._M_current)->m_data).
                                        field_0x1);
              }
              bVar6 = true;
              __n = 0xffffffffffffffff;
            }
            else {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,sVar1
                     ,~sVar16 + __n);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        (local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&__begin3);
              if (__begin3.m_object != (pointer)&__begin3.m_it.array_iterator) {
                operator_delete(__begin3.m_object,
                                (ulong)&((__begin3.m_it.array_iterator._M_current)->m_data).
                                        field_0x1);
              }
              bVar6 = true;
            }
            goto LAB_0016fd1c;
          }
        }
      }
      else {
        pvVar9 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)iTemplate,"fields");
        if ((pvVar9->m_data).m_type == object) {
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                   ::find(&((pvVar9->m_data).m_value.object)->_M_t,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &tname);
          poVar14 = (pvVar9->m_data).m_value.object;
          goto LAB_0016fcd6;
        }
      }
      __n = sVar1;
      bVar6 = false;
    }
    else {
LAB_0016fd19:
      bVar6 = false;
    }
LAB_0016fd1c:
    paVar11 = &tname.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tname._M_dataplus._M_p != paVar11) {
      operator_delete(tname._M_dataplus._M_p,
                      CONCAT71(tname.field_2._M_allocated_capacity._1_7_,
                               tname.field_2._M_local_buf[0]) + 1);
      paVar11 = extraout_RAX;
    }
  } while (bVar6);
  goto LAB_00170244;
LAB_0016fe98:
  do {
    __begin3.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
         ::operator[](local_130,
                      valueNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar15);
    __begin3.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    __begin3.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    __begin3.m_it.primitive_iterator.m_it = -0x8000000000000000;
    vVar2 = ((__begin3.m_object)->m_data).m_type;
    if (vVar2 == null) {
      __begin3.m_it.primitive_iterator.m_it = 1;
LAB_0016ff7c:
      local_60.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_60.m_it.array_iterator._M_current = (pointer)0x0;
      local_60.m_it.primitive_iterator.m_it = 1;
    }
    else if (vVar2 == array) {
      __begin3.m_it.array_iterator._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            *)((((__begin3.m_object)->m_data).m_value.string)->_M_dataplus)._M_p;
      local_60.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_60.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_60.m_it.array_iterator._M_current =
           ((((__begin3.m_object)->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (vVar2 != object) {
        __begin3.m_it.primitive_iterator.m_it = 0;
        goto LAB_0016ff7c;
      }
      __begin3.m_it.object_iterator._M_node =
           (_Base_ptr)(((__begin3.m_object)->m_data).m_value.binary)->m_subtype;
      local_60.m_it.array_iterator._M_current = (pointer)0x0;
      local_60.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_60.m_it.object_iterator._M_node =
           &((((__begin3.m_object)->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
            _M_header;
    }
    local_60.m_object = __begin3.m_object;
    while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             (&__begin3,&local_60), !bVar6) {
      this_01 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*(&__begin3);
      tname._M_dataplus._M_p = (pointer)&tname.field_2;
      tname._M_string_length = 0;
      tname.field_2._M_local_buf[0] = '\0';
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_78 = 0;
      pcStack_70 = (pointer)0x0;
      lVar4 = *(long *)local_e0;
      if ((this_01->m_data).m_type == array) {
        pvVar9 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::operator[](this_01,0);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_100,pvVar9);
        pvVar12 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             (lVar4 + uVar15 * 0x50),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_100);
        pcStack_70 = (pvVar12->_M_dataplus)._M_p;
        local_78 = pvVar12->_M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        vVar2 = (this_01->m_data).m_type;
        if (vVar2 == object) {
          sVar13 = (((this_01->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
                   _M_node_count;
LAB_001700e3:
          if (sVar13 != 1) {
            if (sVar13 != 2) goto LAB_001701ad;
            pvVar9 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](this_01,1);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_100,pvVar9);
            this_02 = &tname;
LAB_0017020a:
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
                      &local_100);
            goto LAB_001700ac;
          }
        }
        else {
          if (vVar2 == array) {
            paVar5 = (this_01->m_data).m_value.array;
            sVar13 = (long)(paVar5->
                           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(paVar5->
                           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 4;
            goto LAB_001700e3;
          }
          if (vVar2 == null) {
LAB_001701ad:
            pvVar9 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](this_01,1);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_100,pvVar9);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tname,
                      &local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1
                             );
            }
            pvVar9 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](this_01,2);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_100,pvVar9);
            this_02 = (string *)&local_b8;
            goto LAB_0017020a;
          }
        }
      }
      else {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_100,this_01);
        pvVar12 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             (lVar4 + uVar15 * 0x50),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_100);
        pcStack_70 = (pvVar12->_M_dataplus)._M_p;
        local_78 = pvVar12->_M_string_length;
LAB_001700ac:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::basic_string_view<char,std::char_traits<char>>&,std::pair<std::__cxx11::string,std::__cxx11::string>&>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)((local_38->
                     super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar15),&local_78,&tname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tname._M_dataplus._M_p != &tname.field_2) {
        operator_delete(tname._M_dataplus._M_p,
                        CONCAT71(tname.field_2._M_allocated_capacity._1_7_,
                                 tname.field_2._M_local_buf[0]) + 1);
      }
      vVar2 = ((__begin3.m_object)->m_data).m_type;
      if (vVar2 == array) {
        __begin3.m_it.array_iterator._M_current = __begin3.m_it.array_iterator._M_current + 1;
      }
      else if (vVar2 == object) {
        __begin3.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(__begin3.m_it.object_iterator._M_node);
      }
      else {
        __begin3.m_it.primitive_iterator.m_it = __begin3.m_it.primitive_iterator.m_it + 1;
      }
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 < (ulong)((long)valueNames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)valueNames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
LAB_0017023a:
  initialize(this);
LAB_00170244:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&valueNames);
  return (bool)(char)local_40;
}

Assistant:

bool TemplateMatcher::loadTemplate(const nlohmann::json& iTemplate)
{
    templateName = fileops::getName(iTemplate);

    auto tnameIndex = templateName.find("${");
    if (tnameIndex == std::string::npos) {
        return false;
    }
    if (tnameIndex == 0) {
        intermediaries.emplace_back("");
    } else {
        intermediaries.push_back(templateName.substr(0, tnameIndex));
    }
    std::vector<std::string> valueNames;
    std::size_t index{0};
    while (tnameIndex != std::string::npos) {
        auto close = templateName.find_first_of('}', tnameIndex);
        const std::string tname = templateName.substr(tnameIndex + 2, close - tnameIndex - 2);
        if (iTemplate.contains("fields")) {
            if (!iTemplate["fields"].contains(tname)) {
                return false;
            }
        } else {
            if (!iTemplate.contains(tname)) {
                return false;
            }
        }

        valueNames.push_back(tname);

        tnameIndex = templateName.find("${", close + 1);
        if (tnameIndex == close + 1) {
            return false;
        }
        if (tnameIndex == std::string::npos) {
            intermediaries.push_back(templateName.substr(close + 1));
        } else {
            intermediaries.push_back(templateName.substr(close + 1, tnameIndex - close - 1));
        }

        ++index;
    }

    templatePossibilities.resize(valueNames.size());
    keys.resize(valueNames.size());
    const nlohmann::json& fieldRoot =
        (iTemplate.contains("fields")) ? iTemplate["fields"] : iTemplate;

    for (index = 0; index < valueNames.size(); ++index) {
        for (const auto& val : fieldRoot[valueNames[index]]) {
            std::pair<std::string, std::string> typeAndUnits;
            std::string_view keyval;
            if (val.is_array()) {
                keyval = keys[index].emplace_back(val[0].get<std::string>());
                switch (val.size()) {
                    case 1:
                        break;
                    case 2:
                        typeAndUnits.first = val[1].get<std::string>();
                        break;
                    case 3:
                    default:
                        typeAndUnits.first = val[1].get<std::string>();
                        typeAndUnits.second = val[2].get<std::string>();
                        break;
                }
            } else {
                keyval = keys[index].emplace_back(val.get<std::string>());
            }
            templatePossibilities[index].emplace(keyval, typeAndUnits);
        }
    }

    initialize();
    return true;
}